

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O2

shared_ptr<mnf::Manifold> __thiscall mnf::RealSpace::getNewCopy_(RealSpace *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  RealSpace *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RealSpace *in_RSI;
  shared_ptr<mnf::Manifold> sVar2;
  shared_ptr<mnf::RealSpace> copy;
  
  this_00 = (RealSpace *)operator_new(0x78);
  RealSpace(this_00,in_RSI);
  std::__shared_ptr<mnf::RealSpace,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<mnf::RealSpace,void>
            ((__shared_ptr<mnf::RealSpace,(__gnu_cxx::_Lock_policy)2> *)&copy,this_00);
  _Var1 = copy.super___shared_ptr<mnf::RealSpace,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  copy.super___shared_ptr<mnf::RealSpace,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Manifold)._vptr_Manifold =
       (_func_int **)copy.super___shared_ptr<mnf::RealSpace,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Manifold).super_RefCounter =
       _Var1._M_pi;
  copy.super___shared_ptr<mnf::RealSpace,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copy.super___shared_ptr<mnf::RealSpace,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> RealSpace::getNewCopy_() const
{
  std::shared_ptr<RealSpace> copy(new RealSpace(*this));
  return copy;
}